

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_test.cpp
# Opt level: O2

int check_results(void)

{
  char cVar1;
  __type _Var2;
  istream *piVar3;
  ostream *poVar4;
  int iVar5;
  char *pcVar6;
  string line2;
  string line1;
  ifstream f2;
  byte abStack_418 [488];
  ifstream f1;
  
  std::ifstream::ifstream(&f1,"./test_files/known_good_jlog.txt",_S_in);
  std::ifstream::ifstream(&f2,"./test_files/jlog.txt",_S_in);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 == '\0') {
    pcVar6 = "TESTS FAILED - couldn\'t open test_files/known_good_jlog.txt\n";
  }
  else {
    cVar1 = std::__basic_file<char>::is_open();
    if (cVar1 != '\0') {
      line1._M_dataplus._M_p = (pointer)&line1.field_2;
      line1._M_string_length = 0;
      line2._M_dataplus._M_p = (pointer)&line2.field_2;
      line2._M_string_length = 0;
      line1.field_2._M_local_buf[0] = '\0';
      line2.field_2._M_local_buf[0] = '\0';
      do {
        piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                           ((istream *)&f1,(string *)&line1);
        if (((byte)piVar3[*(long *)(*(long *)piVar3 + -0x18) + 0x20] & 5) != 0) {
          std::getline<char,std::char_traits<char>,std::allocator<char>>
                    ((istream *)&f2,(string *)&line2);
          if ((abStack_418[*(long *)(_f2 + -0x18)] & 2) == 0) {
            pcVar6 = 
            "TESTS FAILED - compare test_files/jlog.txt with test_files/known_good_jlog.txt (jlog was longer than known_good)\n"
            ;
            poVar4 = (ostream *)&std::cerr;
            goto LAB_001147f1;
          }
          iVar5 = 0;
          std::operator<<((ostream *)&std::cout,"TESTS PASSED\n");
          goto LAB_001147f9;
        }
        piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                           ((istream *)&f2,(string *)&line2);
        if (((byte)piVar3[*(long *)(*(long *)piVar3 + -0x18) + 0x20] & 5) != 0) break;
        _Var2 = std::operator==(&line1,&line2);
      } while (_Var2);
      poVar4 = std::operator<<((ostream *)&std::cerr,
                               "TESTS FAILED - compare test_files/jlog.txt with test_files/known_good_jlog.txt (line "
                              );
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      pcVar6 = ")\n";
LAB_001147f1:
      std::operator<<(poVar4,pcVar6);
      iVar5 = 1;
LAB_001147f9:
      std::__cxx11::string::~string((string *)&line2);
      std::__cxx11::string::~string((string *)&line1);
      goto LAB_0011480b;
    }
    pcVar6 = "TESTS FAILED - couldn\'t open test_files/jlog.txt\n";
  }
  std::operator<<((ostream *)&std::cerr,pcVar6);
  iVar5 = 1;
LAB_0011480b:
  std::ifstream::~ifstream(&f2);
  std::ifstream::~ifstream(&f1);
  return iVar5;
}

Assistant:

int check_results()
{
    ifstream f1("./test_files/known_good_jlog.txt");
    ifstream f2("./test_files/jlog.txt");

    if (!f1.is_open())
    {
        cerr << "TESTS FAILED - couldn't open test_files/known_good_jlog.txt\n";
        return 1;
    }

    if (!f2.is_open())
    {
        cerr << "TESTS FAILED - couldn't open test_files/jlog.txt\n";
        return 1;
    }

    string line1;
    string line2;

    size_t line_number = 0;

    while (getline(f1, line1))
    {
        line_number++;

        if (getline(f2, line2))
        {
            if (line1 == line2)
            {
                continue;
            }
        }
        cerr << "TESTS FAILED - compare test_files/jlog.txt with test_files/known_good_jlog.txt (line " << line_number << ")\n";
        return 1;
    }

    (void)getline(f2, line2);

    if (f2.eof())
    {
        cout << "TESTS PASSED\n";
    }
    else
    {
        cerr << "TESTS FAILED - compare test_files/jlog.txt with test_files/known_good_jlog.txt (jlog was longer than known_good)\n";
        return 1;
    }

    return 0;
}